

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceStub.cpp
# Opt level: O0

void __thiscall irr::CIrrDeviceStub::~CIrrDeviceStub(CIrrDeviceStub *this,void **vtt)

{
  bool bVar1;
  undefined8 *in_RSI;
  IrrlichtDevice *in_RDI;
  IReferenceCounted *in_stack_ffffffffffffffd8;
  
  in_RDI->_vptr_IrrlichtDevice = (_func_int **)*in_RSI;
  *(undefined8 *)((long)&in_RDI->_vptr_IrrlichtDevice + (long)in_RDI->_vptr_IrrlichtDevice[-3]) =
       in_RSI[3];
  if (*(long *)&in_RDI->field_0x10 != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  if (*(long *)&in_RDI->field_0x18 != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  if (*(long *)&in_RDI->field_0x8 != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  if (*(long *)&in_RDI[3].field_0x10 != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  if (*(long *)&in_RDI[2].field_0x8 != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  if (*(long *)&in_RDI[2].field_0x10 != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  if (*(long *)&in_RDI[1].field_0x8 != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  if (in_RDI[2]._vptr_IrrlichtDevice != (_func_int **)0x0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  *(undefined8 *)&in_RDI[1].field_0x8 = 0;
  if (in_RDI[1]._vptr_IrrlichtDevice != (_func_int **)0x0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  bVar1 = IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  if (bVar1) {
    os::Printer::Logger = 0;
  }
  SIrrlichtCreationParameters::~SIrrlichtCreationParameters((SIrrlichtCreationParameters *)0x399cda)
  ;
  IrrlichtDevice::~IrrlichtDevice(in_RDI,(void **)(in_RSI + 1));
  return;
}

Assistant:

CIrrDeviceStub::~CIrrDeviceStub()
{
	if (GUIEnvironment)
		GUIEnvironment->drop();

	if (SceneManager)
		SceneManager->drop();

	if (VideoDriver)
		VideoDriver->drop();

	if (ContextManager)
		ContextManager->drop();

	if (FileSystem)
		FileSystem->drop();

	if (InputReceivingSceneManager)
		InputReceivingSceneManager->drop();

	if (CursorControl)
		CursorControl->drop();

	if (Operator)
		Operator->drop();

	CursorControl = 0;

	if (Timer)
		Timer->drop();

	if (Logger->drop())
		os::Printer::Logger = 0;
}